

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManPrintOccurs(FILE *pFile,If_DsdMan_t *p)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  Vec_Int_t *p_00;
  uint extraout_EDX;
  ulong uVar6;
  uint i;
  uint uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  int local_c4;
  char Buffer [100];
  
  uVar6 = 0;
  local_c4 = 0;
  for (iVar8 = 2; uVar7 = (uint)uVar6, iVar8 < (p->vObjs).nSize; iVar8 = iVar8 + 1) {
    pvVar5 = Vec_PtrEntry(&p->vObjs,iVar8);
    uVar2 = *(uint *)((long)pvVar5 + 4) >> 9;
    uVar3 = uVar2 & 0x3ffff;
    local_c4 = local_c4 + uVar3;
    if (uVar7 <= uVar3) {
      uVar6 = (ulong)uVar2 & 0xffffffff0003ffff;
    }
  }
  if (1 < uVar7) {
    uVar2 = uVar7 - 1;
    uVar7 = 0;
    for (; uVar2 != 0; uVar2 = uVar2 / 10) {
      uVar7 = uVar7 + 1;
    }
  }
  uVar7 = uVar7 * 10 + 10;
  p_00 = Vec_IntStart(uVar7);
  iVar8 = 2;
  do {
    if ((p->vObjs).nSize <= iVar8) {
      fwrite("The distribution of object occurrences:\n",0x28,1,(FILE *)pFile);
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      iVar8 = 0;
      for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
        iVar4 = Vec_IntEntry(p_00,uVar2);
        if (iVar4 != 0) {
          if (uVar2 < 10) {
            fprintf((FILE *)pFile,"%15d : ",(ulong)uVar2);
          }
          else {
            dVar9 = pow(10.0,(double)(uVar2 / 10));
            dVar10 = pow(10.0,(double)(uVar2 / 10));
            sprintf(Buffer,"%d - %d",(ulong)((uVar2 % 10) * (int)dVar9),
                    (ulong)((uVar2 % 10 + 1) * (int)dVar10 - 1));
            fprintf((FILE *)pFile,"%15s : ",Buffer);
          }
          uVar3 = Vec_IntEntry(p_00,uVar2);
          fprintf((FILE *)pFile,"%12d   ",(ulong)uVar3);
          iVar4 = Vec_IntEntry(p_00,uVar2);
          iVar8 = iVar8 + iVar4;
          fprintf((FILE *)pFile,"(%6.2f %%)",((double)iVar8 * 100.0) / (double)(p->vObjs).nSize);
          fputc(10,(FILE *)pFile);
        }
      }
      Vec_IntFree(p_00);
      fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.\n",
              (double)local_c4 / (double)(p->vObjs).nSize,uVar6);
      return;
    }
    pvVar5 = Vec_PtrEntry(&p->vObjs,iVar8);
    uVar3 = *(uint *)((long)pvVar5 + 4) >> 9;
    i = uVar3 & 0x3ffff;
    uVar2 = extraout_EDX;
    if (9 < i) {
      if (i < 100) {
        i = (uint)(byte)((char)(((ushort)uVar3 & 0xff) / 10) + 10);
      }
      else {
        if (i < 1000) {
          uVar2 = (uVar3 & 0xffff) % 100;
          uVar1 = (short)((uVar3 & 0xffff) / 100) + 0x14;
        }
        else {
          if (9999 < i) {
            if (i < 100000) {
              uVar2 = i % 10000;
              i = i / 10000 + 0x28;
            }
            else {
              uVar2 = i % 100000;
              i = i / 100000 + 0x32;
            }
            goto LAB_00386517;
          }
          uVar2 = (uVar3 & 0xffff) % 1000;
          uVar1 = (short)((uVar3 & 0xffff) / 1000) + 0x1e;
        }
        i = (uint)uVar1;
      }
    }
LAB_00386517:
    Vec_IntAddToEntry(p_00,i,uVar2);
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void If_DsdManPrintOccurs( FILE * pFile, If_DsdMan_t * p )
{
    char Buffer[100];
    If_DsdObj_t * pObj;
    Vec_Int_t * vOccurs;
    int nOccurs, nOccursMax, nOccursAll;
    int i, k, nSizeMax, Counter = 0;
    // determine the largest fanin and fanout
    nOccursMax = nOccursAll = 0;
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        nOccursAll += nOccurs;
        nOccursMax  = Abc_MaxInt( nOccursMax, nOccurs );
    }
    // allocate storage for fanin/fanout numbers
    nSizeMax = 10 * (Abc_Base10Log(nOccursMax) + 1);
    vOccurs  = Vec_IntStart( nSizeMax );
    // count the number of fanins and fanouts
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        if ( nOccurs < 10 )
            Vec_IntAddToEntry( vOccurs, nOccurs, 1 );
        else if ( nOccurs < 100 )
            Vec_IntAddToEntry( vOccurs, 10 + nOccurs/10, 1 );
        else if ( nOccurs < 1000 )
            Vec_IntAddToEntry( vOccurs, 20 + nOccurs/100, 1 );
        else if ( nOccurs < 10000 )
            Vec_IntAddToEntry( vOccurs, 30 + nOccurs/1000, 1 );
        else if ( nOccurs < 100000 )
            Vec_IntAddToEntry( vOccurs, 40 + nOccurs/10000, 1 );
        else if ( nOccurs < 1000000 )
            Vec_IntAddToEntry( vOccurs, 50 + nOccurs/100000, 1 );
        else if ( nOccurs < 10000000 )
            Vec_IntAddToEntry( vOccurs, 60 + nOccurs/1000000, 1 );
    }
    fprintf( pFile, "The distribution of object occurrences:\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( Vec_IntEntry(vOccurs, k) == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        fprintf( pFile, "%12d   ", Vec_IntEntry(vOccurs, k) );
        Counter += Vec_IntEntry(vOccurs, k);
        fprintf( pFile, "(%6.2f %%)", 100.0*Counter/Vec_PtrSize(&p->vObjs) );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vOccurs );
    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.\n", nOccursMax,  1.0*nOccursAll/Vec_PtrSize(&p->vObjs) );
}